

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi__zhuffman *z_00;
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc sVar14;
  int iVar15;
  long lVar16;
  char *zout;
  int iVar17;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0018ad39:
    a->num_bits = 0;
    a->hit_zeof_once = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    z_00 = &a->z_distance;
    do {
      iVar7 = 0x1eb500;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar6 = a->code_buffer;
      a->code_buffer = uVar6 >> 1;
      a->num_bits = iVar10 + -1;
      if (iVar10 < 3) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 2;
      uVar12 = iVar10 - 2;
      a->num_bits = uVar12;
      switch(uVar8 & 3) {
      case 0:
        uVar12 = uVar12 & 7;
        if (uVar12 != 0) {
          stbi__zreceive(a,uVar12);
        }
        iVar7 = a->num_bits;
        if (iVar7 < 1) {
          uVar11 = 0;
        }
        else {
          uVar12 = a->code_buffer;
          uVar11 = 0;
          iVar10 = iVar7;
          do {
            *(char *)((long)local_814.fast + uVar11) = (char)uVar12;
            uVar11 = uVar11 + 1;
            uVar12 = uVar12 >> 8;
            iVar7 = iVar10 + -8;
            bVar5 = 8 < iVar10;
            iVar10 = iVar7;
          } while (bVar5);
          a->code_buffer = uVar12;
          a->num_bits = iVar7;
        }
        if (iVar7 < 0) {
LAB_0018b35e:
          stbi__g_failure_reason = "zlib corrupt";
        }
        else {
          if ((uint)uVar11 < 4) {
            psVar13 = a->zbuffer;
            psVar4 = a->zbuffer_end;
            uVar11 = uVar11 & 0xffffffff;
            do {
              if (psVar13 < psVar4) {
                a->zbuffer = psVar13 + 1;
                sVar14 = *psVar13;
                psVar13 = psVar13 + 1;
              }
              else {
                sVar14 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar11) = sVar14;
              uVar11 = uVar11 + 1;
            } while (uVar11 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_0018b35e;
          uVar11 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar11) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar11 <= a->zout_end) ||
                  (iVar7 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar7 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar11);
            a->zbuffer = a->zbuffer + uVar11;
            a->zout = a->zout + uVar11;
            goto LAB_0018b331;
          }
        }
        goto switchD_0018adbb_caseD_3;
      case 1:
        iVar10 = stbi__zbuild_huffman
                           (z,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar10 == 0) goto switchD_0018adbb_caseD_3;
        iVar10 = stbi__zbuild_huffman
                           (z_00,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar10 < 7) {
          stbi__fill_bits(a);
        }
        iVar7 = a->num_bits;
        uVar12 = a->code_buffer;
        a->code_buffer = uVar12 >> 5;
        a->num_bits = iVar7 + -5;
        if (iVar7 < 10) {
          stbi__fill_bits(a);
        }
        iVar7 = a->num_bits;
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 5;
        a->num_bits = iVar7 + -5;
        if (iVar7 < 9) {
          stbi__fill_bits(a);
        }
        uVar12 = uVar12 & 0x1f;
        iVar10 = uVar12 + 0x101;
        iVar15 = (uVar8 & 0x1f) + 1;
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        lVar16 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar9 = a->code_buffer;
          a->code_buffer = uVar9 >> 3;
          a->num_bits = a->num_bits + -3;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes_length_dezigzag)[lVar16]) =
               (byte)uVar9 & 7;
          lVar16 = lVar16 + 1;
        } while ((ulong)(uVar8 & 0xf) + 4 != lVar16);
        iVar7 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar7 == 0) goto switchD_0018adbb_caseD_3;
        iVar17 = iVar15 + iVar10;
        iVar7 = 0;
        while( true ) {
          if (iVar17 <= iVar7) break;
          uVar8 = stbi__zhuffman_decode(a,&local_814);
          if (uVar8 < 0x13) {
            if ((int)uVar8 < 0x10) {
              lVar16 = (long)iVar7;
              iVar7 = iVar7 + 1;
              abStack_9e9[lVar16 + 1] = (char)uVar8;
              bVar5 = true;
            }
            else {
              iVar1 = a->num_bits;
              if (uVar8 == 0x11) {
                if (iVar1 < 3) {
                  stbi__fill_bits(a);
                }
                uVar8 = a->code_buffer;
                a->code_buffer = uVar8 >> 3;
                a->num_bits = a->num_bits + -3;
                uVar8 = (uVar8 & 7) + 3;
LAB_0018b013:
                uVar9 = 0;
LAB_0018b015:
                if ((int)uVar8 <= iVar17 - iVar7) {
                  memset(abStack_9e9 + (long)iVar7 + 1,uVar9,(ulong)uVar8);
                  iVar7 = iVar7 + uVar8;
                  bVar5 = true;
                  goto LAB_0018b062;
                }
              }
              else {
                if (uVar8 != 0x10) {
                  if (iVar1 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar8 = a->code_buffer;
                  a->code_buffer = uVar8 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar8 = (uVar8 & 0x7f) + 0xb;
                  goto LAB_0018b013;
                }
                if (iVar1 < 2) {
                  stbi__fill_bits(a);
                }
                uVar8 = a->code_buffer;
                a->code_buffer = uVar8 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar7 != 0) {
                  uVar8 = (uVar8 & 3) + 3;
                  uVar9 = (uint)abStack_9e9[iVar7];
                  goto LAB_0018b015;
                }
                iVar7 = 0;
              }
              stbi__g_failure_reason = "bad codelengths";
              bVar5 = false;
            }
          }
          else {
            stbi__g_failure_reason = "bad codelengths";
            bVar5 = false;
          }
LAB_0018b062:
          if (!bVar5) goto switchD_0018adbb_caseD_3;
        }
        if (iVar17 != iVar7) {
          stbi__g_failure_reason = "bad codelengths";
          goto switchD_0018adbb_caseD_3;
        }
        iVar10 = stbi__zbuild_huffman(z,(stbi_uc *)((long)abStack_9e9 + 1),iVar10);
        if (iVar10 == 0) goto switchD_0018adbb_caseD_3;
        iVar10 = stbi__zbuild_huffman(z_00,asStack_8e7 + uVar12,iVar15);
        break;
      case 3:
        goto switchD_0018adbb_caseD_3;
      }
      if (iVar10 == 0) goto switchD_0018adbb_caseD_3;
      zout = a->zout;
      do {
        iVar10 = stbi__zhuffman_decode(a,z);
        if (iVar10 < 0x100) {
          if (iVar10 < 0) goto LAB_0018b18e;
          if (a->zout_end <= zout) {
            iVar15 = stbi__zexpand(a,zout,1);
            if (iVar15 == 0) goto LAB_0018b197;
            zout = a->zout;
          }
          *zout = (char)iVar10;
          zout = zout + 1;
          bVar5 = true;
        }
        else if (iVar10 == 0x100) {
          a->zout = zout;
          iVar7 = 1;
          if (a->hit_zeof_once == 0) {
            bVar5 = false;
          }
          else {
            bVar5 = false;
            if (a->num_bits < 0x10) {
              stbi__g_failure_reason = "unexpected end";
              goto LAB_0018b197;
            }
          }
        }
        else {
          if (iVar10 < 0x11e) {
            uVar11 = (ulong)(iVar10 - 0x101);
            uVar12 = stbi__zlength_base[uVar11];
            if (0xffffffffffffffeb < uVar11 - 0x1c) {
              uVar8 = stbi__zreceive(a,stbi__zlength_extra[uVar11]);
              uVar12 = uVar12 + uVar8;
            }
            uVar8 = stbi__zhuffman_decode(a,z_00);
            if (uVar8 < 0x1e) {
              uVar11 = (ulong)uVar8;
              iVar10 = stbi__zdist_base[uVar11];
              if (0xffffffffffffffe5 < uVar11 - 0x1e) {
                uVar8 = stbi__zreceive(a,stbi__zdist_extra[uVar11]);
                iVar10 = iVar10 + uVar8;
              }
              if ((long)zout - (long)a->zout_start < (long)iVar10) {
                stbi__g_failure_reason = "bad dist";
LAB_0018b1f3:
                bVar5 = false;
                iVar7 = 0;
              }
              else {
                if ((long)a->zout_end - (long)zout < (long)(int)uVar12) {
                  iVar15 = stbi__zexpand(a,zout,uVar12);
                  if (iVar15 == 0) goto LAB_0018b1f3;
                  zout = a->zout;
                }
                lVar16 = -(long)iVar10;
                if (iVar10 == 1) {
                  bVar5 = true;
                  if (uVar12 != 0) {
                    memset(zout,(uint)(byte)zout[lVar16],(ulong)uVar12);
                    zout = zout + (ulong)(uVar12 - 1) + 1;
                  }
                }
                else {
                  bVar5 = true;
                  for (; uVar12 != 0; uVar12 = uVar12 - 1) {
                    *zout = zout[lVar16];
                    zout = zout + 1;
                  }
                }
              }
              goto LAB_0018b19a;
            }
          }
LAB_0018b18e:
          stbi__g_failure_reason = "bad huffman code";
LAB_0018b197:
          bVar5 = false;
          iVar7 = 0;
        }
LAB_0018b19a:
      } while (bVar5);
      if (iVar7 == 0) {
        return 0;
      }
LAB_0018b331:
    } while ((uVar6 & 1) == 0);
    iVar7 = 1;
  }
  else {
    pbVar2 = a->zbuffer;
    pbVar3 = a->zbuffer_end;
    uVar12 = 0;
    uVar6 = 0;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar6 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar12 = (uint)*pbVar2;
    }
    if ((a->zbuffer < pbVar3) && ((uVar6 << 8 | uVar12) * -0x42108421 < 0x8421085)) {
      if ((uVar12 & 0x20) == 0) {
        if ((uVar6 & 0xf) == 8) goto LAB_0018ad39;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
switchD_0018adbb_caseD_3:
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}